

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O2

ostream * tcu::Format::operator<<(ostream *str,Array<const_int_*> *fmt)

{
  int *piVar1;
  
  std::operator<<(str,"{ ");
  for (piVar1 = fmt->begin; piVar1 != fmt->end; piVar1 = piVar1 + 1) {
    if (piVar1 != fmt->begin) {
      std::operator<<(str,", ");
    }
    std::ostream::operator<<(str,*piVar1);
  }
  std::operator<<(str," }");
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}